

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O1

Result * validateTrainingInputs<CoreML::Specification::NeuralNetworkClassifier>
                   (Result *__return_storage_ptr__,ModelDescription *modelDescription,
                   NeuralNetworkClassifier *nn)

{
  Rep *pRVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Type *a;
  Type *b;
  LogMessage *pLVar6;
  NeuralNetworkClassifier *pNVar7;
  long *plVar8;
  undefined8 *puVar9;
  long *plVar10;
  undefined1 *puVar11;
  long lVar12;
  undefined1 *b_00;
  char *pcVar13;
  int iVar14;
  long lVar15;
  RepeatedPtrFieldBase *this;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  string trainingInputTarget;
  vector<int,_std::allocator<int>_> trainingInputExclusiveIndices;
  string err;
  string targetTypeString;
  string typeString;
  string target;
  Result r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  int *local_278;
  iterator iStack_270;
  int *local_268;
  NeuralNetworkClassifier *local_260;
  string local_258;
  ulong local_238;
  RepeatedPtrFieldBase *local_230;
  RepeatedPtrFieldBase *local_228;
  long *local_220;
  long local_218;
  long local_210;
  long lStack_208;
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long lStack_1c8;
  long *local_1c0;
  long local_1b8;
  long local_1b0;
  long lStack_1a8;
  long *local_1a0 [2];
  long local_190 [2];
  long *local_180 [2];
  long local_170 [2];
  undefined1 *local_160;
  size_t local_158;
  undefined1 local_150;
  undefined7 uStack_14f;
  LogMessage local_140;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  Result local_c8;
  LogMessage local_a0;
  LogMessage local_68;
  
  local_260 = nn;
  CoreML::Result::Result(&local_c8);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = '\0';
  if ((modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    std::__cxx11::string::_M_replace((ulong)&local_258,0,(char *)0x0,0x3dd090);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_258);
    goto LAB_00325d87;
  }
  local_278 = (int *)0x0;
  iStack_270._M_current = (int *)0x0;
  local_268 = (int *)0x0;
  local_140.level_ = LOGLEVEL_INFO;
  iVar14 = (modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar14) {
    local_230 = &(modelDescription->traininginput_).super_RepeatedPtrFieldBase;
    do {
      a = google::protobuf::internal::RepeatedPtrFieldBase::
          Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                    (local_230,local_140.level_);
      if ((modelDescription->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
LAB_003253d6:
        if (iStack_270._M_current == local_268) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_278,iStack_270,(int *)&local_140);
        }
        else {
          *iStack_270._M_current = local_140.level_;
          iStack_270._M_current = iStack_270._M_current + 1;
        }
      }
      else {
        iVar14 = 1;
        bVar17 = false;
        do {
          b = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                        (&(modelDescription->input_).super_RepeatedPtrFieldBase,iVar14 + -1);
          bVar3 = CoreML::Specification::isEquivalent(a,b);
          if (bVar3) {
            bVar17 = true;
          }
          bVar18 = iVar14 < (modelDescription->input_).super_RepeatedPtrFieldBase.current_size_;
          iVar14 = iVar14 + 1;
        } while (bVar18 && !bVar3);
        if (!bVar17) goto LAB_003253d6;
      }
      local_140.level_ = local_140.level_ + LOGLEVEL_WARNING;
      iVar14 = (modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_;
    } while ((int)local_140.level_ < iVar14);
  }
  if ((long)iStack_270._M_current - (long)local_278 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_258,0,(char *)local_258._M_string_length,0x3dd0ff);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_258);
  }
  else if ((long)iStack_270._M_current - (long)local_278 >> 2 == (long)iVar14) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_258,0,(char *)local_258._M_string_length,0x3dd162);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_258);
  }
  else {
    local_160 = &local_150;
    local_158 = 0;
    local_150 = 0;
    puVar11 = (undefined1 *)local_260->updateparams_;
    if ((NetworkUpdateParameters *)puVar11 == (NetworkUpdateParameters *)0x0) {
      puVar11 = CoreML::Specification::_NetworkUpdateParameters_default_instance_;
    }
    if ((((NetworkUpdateParameters *)puVar11)->losslayers_).super_RepeatedPtrFieldBase.current_size_
        < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar6 = google::protobuf::internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_140,pLVar6);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    iVar14 = (((NetworkUpdateParameters *)puVar11)->losslayers_).super_RepeatedPtrFieldBase.
             current_size_;
    if (*(int *)((long)((((NetworkUpdateParameters *)puVar11)->losslayers_).
                        super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x24) == 10) {
      if (iVar14 < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_140,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                   ,0x358);
        pLVar6 = google::protobuf::internal::LogMessage::operator<<
                           (&local_140,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar6);
        google::protobuf::internal::LogMessage::~LogMessage(&local_140);
      }
LAB_00325666:
      std::__cxx11::string::_M_assign((string *)&local_160);
    }
    else {
      if (iVar14 < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                   ,0x358);
        pLVar6 = google::protobuf::internal::LogMessage::operator<<
                           (&local_a0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_140,pLVar6);
        google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
      }
      if (*(int *)((long)((((NetworkUpdateParameters *)puVar11)->losslayers_).
                          super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x24) == 0xb) {
        if ((((NetworkUpdateParameters *)puVar11)->losslayers_).super_RepeatedPtrFieldBase.
            current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_140,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                     ,0x358);
          pLVar6 = google::protobuf::internal::LogMessage::operator<<
                             (&local_140,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_298,pLVar6);
          google::protobuf::internal::LogMessage::~LogMessage(&local_140);
        }
        goto LAB_00325666;
      }
    }
    bVar17 = iStack_270._M_current != local_278;
    if (iStack_270._M_current == local_278) {
      bVar3 = false;
    }
    else {
      this = &(modelDescription->traininginput_).super_RepeatedPtrFieldBase;
      uVar16 = 0;
      bVar3 = false;
      local_228 = this;
      do {
        local_238 = uVar16;
        pNVar7 = (NeuralNetworkClassifier *)
                 google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (this,local_278[uVar16]);
        plVar8 = (long *)((ulong)(pNVar7->layers_).super_RepeatedPtrFieldBase.arena_ &
                         0xfffffffffffffffe);
        lVar12 = *plVar8;
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_298,lVar12,plVar8[1] + lVar12);
        puVar9 = (undefined8 *)
                 ((ulong)(modelDescription->predictedfeaturename_).tagged_ptr_.ptr_ &
                 0xfffffffffffffffe);
        if ((local_298._M_string_length == puVar9[1]) &&
           ((local_298._M_string_length == 0 ||
            (iVar14 = bcmp(local_298._M_dataplus._M_p,(void *)*puVar9,local_298._M_string_length),
            iVar14 == 0)))) {
          pRVar1 = (modelDescription->output_).super_RepeatedPtrFieldBase.rep_;
          local_230 = (RepeatedPtrFieldBase *)pRVar1->elements;
          if (pRVar1 == (Rep *)0x0) {
            local_230 = (RepeatedPtrFieldBase *)0x0;
          }
          lVar12 = (long)(modelDescription->output_).super_RepeatedPtrFieldBase.current_size_;
          local_260 = pNVar7;
          if (lVar12 != 0) {
            lVar15 = 0;
            do {
              lVar2 = *(long *)((long)&local_230->arena_ + lVar15);
              puVar9 = (undefined8 *)(*(ulong *)(lVar2 + 0x10) & 0xfffffffffffffffe);
              iVar14 = 0;
              bVar18 = false;
              if (local_298._M_string_length == puVar9[1]) {
                if (local_298._M_string_length == 0) {
                  bVar18 = true;
                }
                else {
                  iVar5 = bcmp(local_298._M_dataplus._M_p,(void *)*puVar9,local_298._M_string_length
                              );
                  bVar18 = iVar5 == 0;
                }
              }
              if (bVar18) {
                puVar11 = (undefined1 *)(local_260->layers_).super_RepeatedPtrFieldBase.rep_;
                if ((Rep *)puVar11 == (Rep *)0x0) {
                  puVar11 = CoreML::Specification::_FeatureType_default_instance_;
                }
                b_00 = *(undefined1 **)(lVar2 + 0x20);
                if ((FeatureType *)b_00 == (FeatureType *)0x0) {
                  b_00 = CoreML::Specification::_FeatureType_default_instance_;
                }
                bVar4 = CoreML::Specification::operator==
                                  ((FeatureType *)puVar11,(FeatureType *)b_00);
                if (bVar4) {
                  iVar14 = 0xb;
                  bVar3 = true;
                }
                else {
                  puVar11 = *(undefined1 **)(lVar2 + 0x20);
                  if (puVar11 == (undefined1 *)0x0) {
                    puVar11 = CoreML::Specification::_FeatureType_default_instance_;
                  }
                  pcVar13 = "String";
                  if (*(int *)(puVar11 + 0x24) == 1) {
                    pcVar13 = "Int64";
                  }
                  local_180[0] = local_170;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_180,pcVar13,
                             pcVar13 + (6 - (ulong)(*(int *)(puVar11 + 0x24) == 1)));
                  puVar11 = (undefined1 *)(local_260->layers_).super_RepeatedPtrFieldBase.rep_;
                  if ((Rep *)puVar11 == (Rep *)0x0) {
                    puVar11 = CoreML::Specification::_FeatureType_default_instance_;
                  }
                  bVar4 = *(int *)((long)(((Rep *)puVar11)->elements + 3) + 4) == 1;
                  pcVar13 = "String";
                  if (bVar4) {
                    pcVar13 = "Int64";
                  }
                  local_1a0[0] = local_190;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1a0,pcVar13,pcVar13 + (6 - (ulong)bVar4));
                  std::operator+(&local_e8,"The type of the training input provided: ",&local_298);
                  plVar8 = (long *)std::__cxx11::string::append((char *)&local_e8);
                  plVar10 = plVar8 + 2;
                  if ((long *)*plVar8 == plVar10) {
                    local_1b0 = *plVar10;
                    lStack_1a8 = plVar8[3];
                    local_1c0 = &local_1b0;
                  }
                  else {
                    local_1b0 = *plVar10;
                    local_1c0 = (long *)*plVar8;
                  }
                  local_1b8 = plVar8[1];
                  *plVar8 = (long)plVar10;
                  plVar8[1] = 0;
                  *(undefined1 *)(plVar8 + 2) = 0;
                  plVar8 = (long *)std::__cxx11::string::_M_append
                                             ((char *)&local_1c0,(ulong)local_1a0[0]);
                  local_220 = &local_210;
                  plVar10 = plVar8 + 2;
                  if ((long *)*plVar8 == plVar10) {
                    local_210 = *plVar10;
                    lStack_208 = plVar8[3];
                  }
                  else {
                    local_210 = *plVar10;
                    local_220 = (long *)*plVar8;
                  }
                  local_218 = plVar8[1];
                  *plVar8 = (long)plVar10;
                  plVar8[1] = 0;
                  *(undefined1 *)(plVar8 + 2) = 0;
                  plVar8 = (long *)std::__cxx11::string::append((char *)&local_220);
                  local_200 = &local_1f0;
                  plVar10 = plVar8 + 2;
                  if ((long *)*plVar8 == plVar10) {
                    local_1f0 = *plVar10;
                    lStack_1e8 = plVar8[3];
                  }
                  else {
                    local_1f0 = *plVar10;
                    local_200 = (long *)*plVar8;
                  }
                  local_1f8 = plVar8[1];
                  *plVar8 = (long)plVar10;
                  plVar8[1] = 0;
                  *(undefined1 *)(plVar8 + 2) = 0;
                  plVar8 = (long *)std::__cxx11::string::_M_append
                                             ((char *)&local_200,(ulong)local_180[0]);
                  local_1e0 = &local_1d0;
                  plVar10 = plVar8 + 2;
                  if ((long *)*plVar8 == plVar10) {
                    local_1d0 = *plVar10;
                    lStack_1c8 = plVar8[3];
                  }
                  else {
                    local_1d0 = *plVar10;
                    local_1e0 = (long *)*plVar8;
                  }
                  local_1d8 = plVar8[1];
                  *plVar8 = (long)plVar10;
                  plVar8[1] = 0;
                  *(undefined1 *)(plVar8 + 2) = 0;
                  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1e0);
                  plVar10 = plVar8 + 2;
                  if ((long *)*plVar8 == plVar10) {
                    local_f8 = *plVar10;
                    lStack_f0 = plVar8[3];
                    local_108 = &local_f8;
                  }
                  else {
                    local_f8 = *plVar10;
                    local_108 = (long *)*plVar8;
                  }
                  local_100 = plVar8[1];
                  *plVar8 = (long)plVar10;
                  plVar8[1] = 0;
                  *(undefined1 *)(plVar8 + 2) = 0;
                  std::__cxx11::string::operator=((string *)&local_258,(string *)&local_108);
                  if (local_108 != &local_f8) {
                    operator_delete(local_108,local_f8 + 1);
                  }
                  if (local_1e0 != &local_1d0) {
                    operator_delete(local_1e0,local_1d0 + 1);
                  }
                  if (local_200 != &local_1f0) {
                    operator_delete(local_200,local_1f0 + 1);
                  }
                  if (local_220 != &local_210) {
                    operator_delete(local_220,local_210 + 1);
                  }
                  if (local_1c0 != &local_1b0) {
                    operator_delete(local_1c0,local_1b0 + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                    operator_delete(local_e8._M_dataplus._M_p,
                                    local_e8.field_2._M_allocated_capacity + 1);
                  }
                  CoreML::Result::Result
                            (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_258
                            );
                  if (local_1a0[0] != local_190) {
                    operator_delete(local_1a0[0],local_190[0] + 1);
                  }
                  if (local_180[0] != local_170) {
                    operator_delete(local_180[0],local_170[0] + 1);
                  }
                  iVar14 = 1;
                }
              }
              this = local_228;
              if (bVar18) goto LAB_00325c87;
              lVar15 = lVar15 + 8;
            } while (lVar12 * 8 != lVar15);
          }
          iVar14 = 0xb;
LAB_00325c87:
          uVar16 = local_238;
          if (iVar14 == 0xb) goto LAB_00325724;
        }
        else {
LAB_00325724:
          uVar16 = local_238;
          iVar14 = 0;
          if (local_158 == local_298._M_string_length) {
            if (local_158 == 0) {
              bVar3 = true;
            }
            else {
              iVar5 = bcmp(local_160,local_298._M_dataplus._M_p,local_158);
              if (iVar5 == 0) {
                bVar3 = true;
              }
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if (iVar14 != 0) break;
        uVar16 = uVar16 + 1;
        bVar17 = uVar16 < (ulong)((long)iStack_270._M_current - (long)local_278 >> 2);
      } while (bVar17);
    }
    if (!bVar17) {
      if (bVar3) {
        CoreML::Result::Result(__return_storage_ptr__);
      }
      else {
        std::operator+(&local_298,
                       "The training inputs don\'t include the target of the classifier: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(modelDescription->predictedfeaturename_).tagged_ptr_.ptr_ &
                       0xfffffffffffffffe));
        std::__cxx11::string::operator=((string *)&local_258,(string *)&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        CoreML::Result::Result
                  (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_258);
      }
    }
    if (local_160 != &local_150) {
      operator_delete(local_160,CONCAT71(uStack_14f,local_150) + 1);
    }
  }
  if (local_278 != (int *)0x0) {
    operator_delete(local_278,(long)local_268 - (long)local_278);
  }
LAB_00325d87:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,
                    CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                             local_258.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_message._M_dataplus._M_p != &local_c8.m_message.field_2) {
    operator_delete(local_c8.m_message._M_dataplus._M_p,
                    local_c8.m_message.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateTrainingInputs(const Specification::ModelDescription& modelDescription, const T& nn) {
    Result r;
    std::string err;

    if (modelDescription.traininginput_size() <= 1) {
        err = "Must provide training inputs for updatable neural network (expecting both input and target for loss function).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    std::vector<int> trainingInputExclusiveIndices;
    for (int i = 0; i < modelDescription.traininginput_size(); i++) {
        const Specification::FeatureDescription& trainingInput = modelDescription.traininginput(i);
        bool trainingInputIsPredictionInput = false;
        for (int j = 0; j < modelDescription.input_size(); j++) {
            const Specification::FeatureDescription& input = modelDescription.input(j);
            if (Specification::isEquivalent(trainingInput, input)) {
                trainingInputIsPredictionInput = true;
                break;
            }
        }
        if (!trainingInputIsPredictionInput) {
            trainingInputExclusiveIndices.push_back(i);
        }
    }

    // Check that training inputs are specified to at least contain the target (which we'll validate is the target further down)
    if (trainingInputExclusiveIndices.size() < 1) {
        err = "Training inputs don't describe required inputs for the loss (needs both the input and the target).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    // Ensure other inputs (excluding the target) are present
    // This should prevent issues where the only training input described is the target itself
    // Given we don't yet know what inputs are explicitly required for training we can't vet beyond this for what model inputs to require
    size_t numberOfNonExclusiveTrainingInputs = static_cast<size_t>(modelDescription.traininginput_size()) - trainingInputExclusiveIndices.size();
    if (numberOfNonExclusiveTrainingInputs <= 0) { // Given at least one input from the inference model's inputs must be supplied this should be positive
        err = "The training inputs must include at least one input from the model itself as required for training (should have at least one input in common with those used for prediction).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    std::string target;
    const Specification::NetworkUpdateParameters& updateParams = nn.updateparams();
    if (updateParams.losslayers(0).has_categoricalcrossentropylosslayer()) {
        target = updateParams.losslayers(0).categoricalcrossentropylosslayer().target();
    } else if (updateParams.losslayers(0).has_meansquarederrorlosslayer()) {
        target = updateParams.losslayers(0).meansquarederrorlosslayer().target();
    }

    bool isClassifier = (dynamic_cast<const Specification::NeuralNetworkClassifier*>(&nn) != nullptr);

    bool trainingInputMeetsRequirement = false;
    for (size_t i = 0; i < trainingInputExclusiveIndices.size(); i++) {
        const Specification::FeatureDescription& trainingInputDescription = modelDescription.traininginput(trainingInputExclusiveIndices[i]);
        std::string trainingInputTarget = trainingInputDescription.name();

        // If the neural network is a classifier, check if the predictedFeatureNames is a training input (and ensure matching types)
        if (isClassifier) {
            if (trainingInputTarget == modelDescription.predictedfeaturename()) {

                // Find the predictedFeatureName's output and use to check types
                for (const auto& output : modelDescription.output()) {
                    if (trainingInputTarget == output.name()) {
                        if (trainingInputDescription.type() == output.type()) {
                            trainingInputMeetsRequirement = true;
                            break;
                        } else {
                            std::string typeString = output.type().has_int64type() ? "Int64" : "String";
                            std::string targetTypeString = trainingInputDescription.type().has_int64type() ? "Int64" : "String";
                            err = "The type of the training input provided: " + trainingInputTarget + " doesn't match the expected type of the classifier. Found: " + targetTypeString + ", expected: " + typeString + ".";
                            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
                        }
                    }
                }
            }
        }

        // If NN was not a classifier (or predictedFeatureName was not in the training inputs), ensure the target is in the training inputs
        if (target == trainingInputTarget) {
            trainingInputMeetsRequirement = true;
        }
    }

    // Raise an error if the target isn't found (or if the target or predictedFeatureNames aren't found for classifiers)
    // Users can supply either / or for a classifier, but if neither is found we'll request the predictedFeatureNames
    if (!trainingInputMeetsRequirement) {
        if (isClassifier) {
            err = "The training inputs don't include the target of the classifier: " + modelDescription.predictedfeaturename();
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
        err = "The training inputs don't include the loss layer's target: " + target;
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    return Result();
}